

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O1

void ecx_readeeprom1(ecx_contextt *context,uint16 slave,uint16 eeproma)

{
  uint16 configadr;
  uint16 uVar1;
  int iVar2;
  ulong in_RAX;
  undefined6 in_register_00000032;
  uint uVar3;
  bool bVar4;
  uint16 estat;
  ec_eepromt ed;
  undefined8 local_28;
  
  local_28 = in_RAX;
  ecx_eeprom2master(context,slave);
  configadr = context->slavelist[CONCAT62(in_register_00000032,slave) & 0xffffffff].configadr;
  uVar1 = ecx_eeprom_waitnotbusyFP(context,configadr,(uint16 *)&local_28,20000);
  if (uVar1 != 0) {
    if ((local_28 & 0x7800) != 0) {
      local_28 = local_28 & 0xffffffffffff0000;
      ecx_FPWR(context->port,configadr,0x502,2,&local_28,6000);
    }
    local_28 = (ulong)CONCAT24(eeproma,CONCAT22(0x100,(uint16)local_28));
    uVar3 = 0;
    do {
      iVar2 = ecx_FPWR(context->port,configadr,0x502,6,(void *)((long)&local_28 + 2),2000);
      if (0 < iVar2) {
        return;
      }
      bVar4 = uVar3 < 3;
      uVar3 = uVar3 + 1;
    } while (bVar4);
  }
  return;
}

Assistant:

void ecx_readeeprom1(ecx_contextt *context, uint16 slave, uint16 eeproma)
{
   uint16 configadr, estat;
   ec_eepromt ed;
   int wkc, cnt = 0;

   ecx_eeprom2master(context, slave); /* set eeprom control to master */
   configadr = context->slavelist[slave].configadr;
   if (ecx_eeprom_waitnotbusyFP(context, configadr, &estat, EC_TIMEOUTEEP))
   {
      if (estat & EC_ESTAT_EMASK) /* error bits are set */
      {
         estat = htoes(EC_ECMD_NOP); /* clear error bits */
         wkc = ecx_FPWR(context->port, configadr, ECT_REG_EEPCTL, sizeof(estat), &estat, EC_TIMEOUTRET3);
      }
      ed.comm = htoes(EC_ECMD_READ);
      ed.addr = htoes(eeproma);
      ed.d2   = 0x0000;
      do
      {
         wkc = ecx_FPWR(context->port, configadr, ECT_REG_EEPCTL, sizeof(ed), &ed, EC_TIMEOUTRET);
      }
      while ((wkc <= 0) && (cnt++ < EC_DEFAULTRETRIES));
   }
}